

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combination.c
# Opt level: O1

Aig_Man_t * generateGeneralDisjunctiveTester(Abc_Ntk_t *pNtk,Aig_Man_t *pAig,int combK)

{
  uint uVar1;
  uint uVar2;
  Aig_Man_t *p;
  size_t sVar3;
  char *__s;
  Aig_Obj_t *pAVar4;
  long lVar5;
  uint *__ptr;
  void *pvVar6;
  Vec_Ptr_t *pVVar7;
  void **ppvVar8;
  uint *__ptr_00;
  ulong uVar9;
  Aig_Obj_t *p1;
  uint uVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  int combK_00;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  bool bVar18;
  int local_38;
  
  iVar15 = pAig->nRegs;
  p = Aig_ManStart(pAig->vObjs->nSize);
  sVar3 = strlen(pAig->pName);
  __s = (char *)malloc(sVar3 + 5);
  p->pName = __s;
  iVar12 = 0;
  sprintf(__s,"%s_%s",pAig->pName,"nCk");
  p->pSpec = (char *)0x0;
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  if (0 < pAig->nTruePis) {
    lVar11 = 0;
    do {
      if (pAig->vCis->nSize <= lVar11) goto LAB_00635e24;
      pvVar6 = pAig->vCis->pArray[lVar11];
      pAVar4 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar6 + 0x28) = pAVar4;
      lVar11 = lVar11 + 1;
    } while (lVar11 < pAig->nTruePis);
  }
  if (0 < pAig->nRegs) {
    iVar12 = 0;
    do {
      uVar2 = pAig->nTruePis + iVar12;
      if (((int)uVar2 < 0) || (pAig->vCis->nSize <= (int)uVar2)) goto LAB_00635e24;
      pvVar6 = pAig->vCis->pArray[uVar2];
      iVar12 = iVar12 + 1;
      pAVar4 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar6 + 0x28) = pAVar4;
    } while (iVar12 < pAig->nRegs);
  }
  if (combK < 1) {
    lVar11 = 0;
  }
  else {
    uVar17 = 1;
    lVar11 = 0;
    do {
      lVar5 = countCombination((long)iVar15,uVar17);
      lVar11 = lVar11 + lVar5;
      uVar17 = uVar17 + 1;
    } while (combK + 1 != uVar17);
  }
  if (lVar11 < 1) {
    __assert_fail("lCombinationCount > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/live/combination.c"
                  ,0x181,
                  "Aig_Man_t *generateGeneralDisjunctiveTester(Abc_Ntk_t *, Aig_Man_t *, int)");
  }
  __ptr = (uint *)malloc(0x10);
  uVar2 = 8;
  if (6 < (uint)lVar11 - 1) {
    uVar2 = (uint)lVar11;
  }
  __ptr[1] = 0;
  *__ptr = uVar2;
  lVar5 = (long)(int)uVar2;
  if (uVar2 == 0) {
    pvVar6 = (void *)0x0;
  }
  else {
    pvVar6 = malloc(lVar5 * 8);
  }
  *(void **)(__ptr + 2) = pvVar6;
  lVar14 = 1;
  lVar13 = 1;
  if (1 < lVar11) {
    lVar14 = lVar11;
    lVar13 = lVar11;
  }
  do {
    pAVar4 = Aig_ObjCreateCi(p);
    uVar1 = __ptr[1];
    uVar16 = *__ptr;
    if (uVar1 == uVar16) {
      if ((int)uVar16 < 0x10) {
        if (*(void **)(__ptr + 2) == (void *)0x0) {
          pvVar6 = malloc(0x80);
        }
        else {
          pvVar6 = realloc(*(void **)(__ptr + 2),0x80);
        }
        uVar10 = 0x10;
      }
      else {
        uVar10 = uVar16 * 2;
        if ((int)uVar10 <= (int)uVar16) goto LAB_006359ae;
        if (*(void **)(__ptr + 2) == (void *)0x0) {
          pvVar6 = malloc((ulong)uVar16 << 4);
        }
        else {
          pvVar6 = realloc(*(void **)(__ptr + 2),(ulong)uVar16 << 4);
        }
      }
      *(void **)(__ptr + 2) = pvVar6;
      *__ptr = uVar10;
    }
LAB_006359ae:
    __ptr[1] = uVar1 + 1;
    *(Aig_Obj_t **)(*(long *)(__ptr + 2) + (long)(int)uVar1 * 8) = pAVar4;
    lVar14 = lVar14 + -1;
  } while (lVar14 != 0);
  pVVar7 = pAig->vObjs;
  if (0 < pVVar7->nSize) {
    lVar14 = 0;
    do {
      pvVar6 = pVVar7->pArray[lVar14];
      if ((pvVar6 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar6 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar6 & 1) != 0) goto LAB_00635e43;
        uVar17 = *(ulong *)((long)pvVar6 + 8) & 0xfffffffffffffffe;
        if (uVar17 == 0) {
          pAVar4 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar4 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar6 + 8) & 1) ^ *(ulong *)(uVar17 + 0x28));
        }
        uVar17 = *(ulong *)((long)pvVar6 + 0x10) & 0xfffffffffffffffe;
        if (uVar17 == 0) {
          p1 = (Aig_Obj_t *)0x0;
        }
        else {
          p1 = (Aig_Obj_t *)
               ((ulong)((uint)*(ulong *)((long)pvVar6 + 0x10) & 1) ^ *(ulong *)(uVar17 + 0x28));
        }
        pAVar4 = Aig_And(p,pAVar4,p1);
        *(Aig_Obj_t **)((long)pvVar6 + 0x28) = pAVar4;
      }
      lVar14 = lVar14 + 1;
      pVVar7 = pAig->vObjs;
    } while (lVar14 < pVVar7->nSize);
  }
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  pVVar7->nSize = 0;
  pVVar7->nCap = uVar2;
  if (uVar2 == 0) {
    ppvVar8 = (void **)0x0;
  }
  else {
    ppvVar8 = (void **)malloc(lVar5 * 8);
  }
  pVVar7->pArray = ppvVar8;
  if (0 < combK) {
    combK_00 = 1;
    do {
      generateCombinatorialStabilExhaust(p,pAig,pVVar7,iVar15,combK_00);
      bVar18 = combK_00 != combK;
      combK_00 = combK_00 + 1;
    } while (bVar18);
  }
  __ptr_00 = (uint *)malloc(0x10);
  __ptr_00[1] = 0;
  *__ptr_00 = uVar2;
  if (uVar2 == 0) {
    pvVar6 = (void *)0x0;
  }
  else {
    pvVar6 = malloc(lVar5 << 3);
  }
  *(void **)(__ptr_00 + 2) = pvVar6;
  lVar5 = 1;
  if (1 < lVar11) {
    lVar5 = lVar11;
  }
  lVar14 = 0;
  do {
    if (((lVar14 == 0x80000000) || (uVar2 = (uint)lVar14, (int)__ptr[1] <= (int)uVar2)) ||
       (pVVar7->nSize <= (int)uVar2)) goto LAB_00635e24;
    pAVar4 = Aig_Or(p,(Aig_Obj_t *)((ulong)pVVar7->pArray[uVar2 & 0x7fffffff] ^ 1),
                    *(Aig_Obj_t **)(*(long *)(__ptr + 2) + (ulong)(uVar2 & 0x7fffffff) * 8));
    uVar2 = __ptr_00[1];
    uVar1 = *__ptr_00;
    if (uVar2 == uVar1) {
      if ((int)uVar1 < 0x10) {
        if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
          pvVar6 = malloc(0x80);
        }
        else {
          pvVar6 = realloc(*(void **)(__ptr_00 + 2),0x80);
        }
        uVar16 = 0x10;
      }
      else {
        uVar16 = uVar1 * 2;
        if ((int)uVar16 <= (int)uVar1) goto LAB_00635bd8;
        if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
          pvVar6 = malloc((ulong)uVar1 << 4);
        }
        else {
          pvVar6 = realloc(*(void **)(__ptr_00 + 2),(ulong)uVar1 << 4);
        }
      }
      *(void **)(__ptr_00 + 2) = pvVar6;
      *__ptr_00 = uVar16;
    }
LAB_00635bd8:
    __ptr_00[1] = uVar2 + 1;
    *(Aig_Obj_t **)(*(long *)(__ptr_00 + 2) + (long)(int)uVar2 * 8) = pAVar4;
    lVar14 = lVar14 + 1;
  } while (lVar5 != lVar14);
  if (0 < pAig->nTruePos) {
    lVar5 = 0;
    do {
      if (pAig->vCos->nSize <= lVar5) goto LAB_00635e24;
      pvVar6 = pAig->vCos->pArray[lVar5];
      if (((ulong)pvVar6 & 1) != 0) goto LAB_00635e43;
      uVar17 = *(ulong *)((long)pvVar6 + 8) & 0xfffffffffffffffe;
      if (uVar17 == 0) {
        pAVar4 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar4 = (Aig_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar6 + 8) & 1) ^ *(ulong *)(uVar17 + 0x28));
      }
      pAVar4 = Aig_ObjCreateCo(p,pAVar4);
      *(Aig_Obj_t **)((long)pvVar6 + 0x28) = pAVar4;
      lVar5 = lVar5 + 1;
    } while (lVar5 < pAig->nTruePos);
  }
  lVar5 = 1;
  if (1 < lVar11) {
    lVar5 = lVar11;
  }
  lVar14 = 0;
  do {
    if ((lVar14 == 0x80000000) || ((int)__ptr_00[1] <= (int)(uint)lVar14)) goto LAB_00635e24;
    Aig_ObjCreateCo(p,*(Aig_Obj_t **)
                       (*(long *)(__ptr_00 + 2) + (ulong)((uint)lVar14 & 0x7fffffff) * 8));
    lVar14 = lVar14 + 1;
  } while (lVar5 != lVar14);
  if (pAig->nRegs < 1) {
    iVar15 = 0;
  }
  else {
    iVar15 = 0;
    do {
      uVar2 = pAig->nTruePos + iVar15;
      if (((int)uVar2 < 0) || (pAig->vCos->nSize <= (int)uVar2)) goto LAB_00635e24;
      pvVar6 = pAig->vCos->pArray[uVar2];
      if (((ulong)pvVar6 & 1) != 0) {
LAB_00635e43:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar17 = *(ulong *)((long)pvVar6 + 8);
      uVar9 = uVar17 & 0xfffffffffffffffe;
      if (uVar9 == 0) {
        pAVar4 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar4 = (Aig_Obj_t *)((ulong)((uint)uVar17 & 1) ^ *(ulong *)(uVar9 + 0x28));
      }
      iVar15 = iVar15 + 1;
      Aig_ObjCreateCo(p,pAVar4);
    } while (iVar15 < pAig->nRegs);
  }
  lVar5 = 1;
  if (1 < lVar11) {
    lVar5 = lVar11;
  }
  lVar11 = 0;
  while ((lVar11 != 0x80000000 && (uVar2 = (uint)lVar11, (int)uVar2 < (int)__ptr_00[1]))) {
    lVar11 = lVar11 + 1;
    Aig_ObjCreateCo(p,*(Aig_Obj_t **)(*(long *)(__ptr_00 + 2) + (ulong)(uVar2 & 0x7fffffff) * 8));
    if (lVar5 == lVar11) {
      local_38 = (int)lVar13;
      if (iVar15 + (int)lVar5 != iVar12 + local_38) {
        __assert_fail("liCopied + liCreated == loCopied + loCreated",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/live/combination.c"
                      ,0x1c1,
                      "Aig_Man_t *generateGeneralDisjunctiveTester(Abc_Ntk_t *, Aig_Man_t *, int)");
      }
      Aig_ManSetRegNum(p,iVar12 + local_38);
      Aig_ManCleanup(p);
      iVar15 = Aig_ManCheck(p);
      if (iVar15 == 0) {
        __assert_fail("Aig_ManCheck( pNewAig )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/live/combination.c"
                      ,0x1c6,
                      "Aig_Man_t *generateGeneralDisjunctiveTester(Abc_Ntk_t *, Aig_Man_t *, int)");
      }
      if (*(void **)(__ptr + 2) != (void *)0x0) {
        free(*(void **)(__ptr + 2));
        __ptr[2] = 0;
        __ptr[3] = 0;
      }
      free(__ptr);
      if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
        free(*(void **)(__ptr_00 + 2));
        __ptr_00[2] = 0;
        __ptr_00[3] = 0;
      }
      free(__ptr_00);
      if (pVVar7->pArray != (void **)0x0) {
        free(pVVar7->pArray);
        pVVar7->pArray = (void **)0x0;
      }
      free(pVVar7);
      return p;
    }
  }
LAB_00635e24:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Aig_Man_t *generateGeneralDisjunctiveTester( Abc_Ntk_t *pNtk, Aig_Man_t *pAig, int combK )
{
    //AIG creation related data structure
    Aig_Man_t *pNewAig;
    int piCopied = 0, loCopied = 0, loCreated = 0, liCopied = 0, liCreated = 0, poCopied = 0;
    //int i, iElem, nRegCount, hintSingalBeginningMarker, hintSingalEndMarker;
    int i, nRegCount;
    int combN_internal, combK_internal; //, targetPoIndex;
    long longI, lCombinationCount;
    //Aig_Obj_t *pObj, *pObjMonoCand, *pObjLO_nCk, *pObjDisj_nCk;
    Aig_Obj_t *pObj, *pObjLO_nCk, *pObjDisj_nCk;
    Vec_Ptr_t *vLO_nCk, *vPODriver_nCk, *vDisj_nCk;

    extern Vec_Int_t *findHintOutputs(Abc_Ntk_t *pNtk);
    
    //Knuth's Data Strcuture
    //Vec_Int_t *vC_KNUTH;
    //int i_KNUTH, j_KNUTH, combCounter_KNUTH = 0;

    //Collecting target HINT signals
    //vCandidateMonotoneSignals = findHintOutputs(pNtk);
    //if( vCandidateMonotoneSignals == NULL )
    //{
    //    printf("\nTraget Signal Set is Empty: Duplicating given AIG\n");
    //    combN_internal = 0;
    //}
    //else
    //{
        //Vec_IntForEachEntry( vCandidateMonotoneSignals, iElem, i )
        //    printf("Po[%d] = %s\n", iElem, Abc_ObjName( Abc_NtkPo(pNtk, iElem) ) );
    //    hintSingalBeginningMarker = Vec_IntEntry( vCandidateMonotoneSignals, 0 );
    //    hintSingalEndMarker = Vec_IntEntry( vCandidateMonotoneSignals, Vec_IntSize(vCandidateMonotoneSignals) - 1 );
    //    combN_internal = hintSingalEndMarker - hintSingalBeginningMarker + 1;
    //}

    combN_internal = Aig_ManRegNum(pAig);

    pNewAig = Aig_ManStart( Aig_ManObjNumMax(pAig) );
    pNewAig->pName = (char *)malloc( strlen( pAig->pName ) + strlen("_nCk") + 1 );
    sprintf(pNewAig->pName, "%s_%s", pAig->pName, "nCk");
        pNewAig->pSpec = NULL;

    //Standard Mapping of Constant Nodes
    pObj = Aig_ManConst1( pAig );
        pObj->pData = Aig_ManConst1( pNewAig );

    //Standard AIG PI duplication
    Saig_ManForEachPi( pAig, pObj, i )
    {
        piCopied++;
        pObj->pData = Aig_ObjCreateCi(pNewAig);
    }

    //Standard AIG LO duplication
    Saig_ManForEachLo( pAig, pObj, i )
        {
        loCopied++;
        pObj->pData = Aig_ObjCreateCi(pNewAig);
        }

    //nCk LO creation
    lCombinationCount = 0;
    for(combK_internal=1; combK_internal<=combK; combK_internal++)
        lCombinationCount += countCombination( combN_internal, combK_internal );
    assert( lCombinationCount > 0 );
    vLO_nCk = Vec_PtrAlloc(lCombinationCount);
    for( longI = 0; longI < lCombinationCount; longI++ )
    {
        loCreated++;
        pObj = Aig_ObjCreateCi(pNewAig);
        Vec_PtrPush( vLO_nCk, pObj );
    }

    //Standard Node duplication
    Aig_ManForEachNode( pAig, pObj, i )
    {
        pObj->pData = Aig_And( pNewAig, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    }
    
    //nCk specific logic creation (i.e. nCk number of OR gates)
    vDisj_nCk = Vec_PtrAlloc(lCombinationCount);

    for( combK_internal=1; combK_internal<=combK; combK_internal++ )
    {
        generateCombinatorialStabilExhaust( pNewAig, pAig,
                vDisj_nCk, combN_internal, combK_internal );
    }


    //creation of implication logic
    vPODriver_nCk = Vec_PtrAlloc(lCombinationCount);
    for( longI = 0; longI < lCombinationCount; longI++ )
    {
        pObjLO_nCk = (Aig_Obj_t *)(Vec_PtrEntry( vLO_nCk, longI ));
        pObjDisj_nCk = (Aig_Obj_t *)(Vec_PtrEntry( vDisj_nCk, longI ));

        pObj = Aig_Or( pNewAig, Aig_Not(pObjDisj_nCk), pObjLO_nCk);
        Vec_PtrPush(vPODriver_nCk, pObj);
    }
    
    //Standard PO duplication
    Saig_ManForEachPo( pAig, pObj, i )
    {
        poCopied++;
        pObj->pData = Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) ); 
    }

    //nCk specific PO creation
    for( longI = 0; longI < lCombinationCount; longI++ )
    {
        Aig_ObjCreateCo( pNewAig, (Aig_Obj_t *)(Vec_PtrEntry( vPODriver_nCk, longI )) );
    }

    //Standard LI duplication
    Saig_ManForEachLi( pAig, pObj, i )
    {
        liCopied++;
        Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) );
    }

    //nCk specific LI creation
    for( longI = 0; longI < lCombinationCount; longI++ )
    {
        liCreated++;
        Aig_ObjCreateCo( pNewAig, (Aig_Obj_t *)(Vec_PtrEntry( vPODriver_nCk, longI )) );
    }

    //clean-up, book-keeping
    assert( liCopied + liCreated == loCopied + loCreated );    
    nRegCount = loCopied + loCreated;

    Aig_ManSetRegNum( pNewAig, nRegCount );
    Aig_ManCleanup( pNewAig );
    assert( Aig_ManCheck( pNewAig ) );
    
    Vec_PtrFree(vLO_nCk);
    Vec_PtrFree(vPODriver_nCk);
    Vec_PtrFree(vDisj_nCk);
    //Vec_IntFree(vC_KNUTH);    
    return pNewAig;
}